

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<double>_>::PutVal
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t r,int64_t c,complex<double> *value)

{
  complex<double> **ppcVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  complex<double> *pcVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  complex<double> a;
  
  lVar8 = r - c;
  lVar3 = r;
  if (lVar8 == 0 || r < c) {
    lVar8 = -(r - c);
    lVar3 = c;
  }
  ppcVar1 = (this->fElem).fStore;
  pcVar5 = ppcVar1[lVar3];
  lVar7 = (long)ppcVar1[lVar3 + 1] - (long)pcVar5 >> 4;
  if (lVar7 <= lVar8) {
    a._M_value._8_8_ = r;
    a._M_value._0_8_ = this;
    bVar4 = IsZero(a);
    if (!bVar4) {
      poVar6 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size");
      std::ostream::_M_insert<long>((long)poVar6);
      std::ostream::flush();
      TPZMatrix<std::complex<double>_>::Error
                ("virtual int TPZSkylMatrix<std::complex<double>>::PutVal(const int64_t, const int64_t, const TVar &) [TVar = std::complex<double>]"
                 ,"Index out of range");
      pcVar5 = (this->fElem).fStore[lVar3];
      goto LAB_00d4ea59;
    }
    ppcVar1 = (this->fElem).fStore;
    pcVar5 = ppcVar1[lVar3];
    lVar7 = (long)ppcVar1[lVar3 + 1] - (long)pcVar5 >> 4;
  }
  if (lVar7 <= lVar8) {
    return 1;
  }
LAB_00d4ea59:
  uVar2 = *(undefined8 *)(value->_M_value + 8);
  *(undefined8 *)pcVar5[lVar8]._M_value = *(undefined8 *)value->_M_value;
  *(undefined8 *)(pcVar5[lVar8]._M_value + 8) = uVar2;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}